

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BamAlignment.cpp
# Opt level: O1

void __thiscall BamTools::BamAlignment::BamAlignment(BamAlignment *this,BamAlignment *other)

{
  pointer pcVar1;
  int32_t iVar2;
  uint16_t uVar3;
  uint32_t uVar4;
  uint32_t uVar5;
  uint32_t uVar6;
  
  (this->Name)._M_dataplus._M_p = (pointer)&(this->Name).field_2;
  pcVar1 = (other->Name)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)this,pcVar1,pcVar1 + (other->Name)._M_string_length);
  this->Length = other->Length;
  (this->QueryBases)._M_dataplus._M_p = (pointer)&(this->QueryBases).field_2;
  pcVar1 = (other->QueryBases)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->QueryBases,pcVar1,pcVar1 + (other->QueryBases)._M_string_length);
  (this->AlignedBases)._M_dataplus._M_p = (pointer)&(this->AlignedBases).field_2;
  pcVar1 = (other->AlignedBases)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->AlignedBases,pcVar1,pcVar1 + (other->AlignedBases)._M_string_length);
  (this->Qualities)._M_dataplus._M_p = (pointer)&(this->Qualities).field_2;
  pcVar1 = (other->Qualities)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->Qualities,pcVar1,pcVar1 + (other->Qualities)._M_string_length);
  (this->TagData)._M_dataplus._M_p = (pointer)&(this->TagData).field_2;
  pcVar1 = (other->TagData)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->TagData,pcVar1,pcVar1 + (other->TagData)._M_string_length);
  iVar2 = other->Position;
  this->RefID = other->RefID;
  this->Position = iVar2;
  uVar3 = other->MapQuality;
  this->Bin = other->Bin;
  this->MapQuality = uVar3;
  this->AlignmentFlag = other->AlignmentFlag;
  std::vector<BamTools::CigarOp,_std::allocator<BamTools::CigarOp>_>::vector
            (&this->CigarData,&other->CigarData);
  iVar2 = other->MatePosition;
  this->MateRefID = other->MateRefID;
  this->MatePosition = iVar2;
  this->InsertSize = other->InsertSize;
  (this->Filename)._M_dataplus._M_p = (pointer)&(this->Filename).field_2;
  pcVar1 = (other->Filename)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->Filename,pcVar1,pcVar1 + (other->Filename)._M_string_length);
  (this->SupportData).AllCharData._M_dataplus._M_p =
       (pointer)&(this->SupportData).AllCharData.field_2;
  pcVar1 = (other->SupportData).AllCharData._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->SupportData,pcVar1,
             pcVar1 + (other->SupportData).AllCharData._M_string_length);
  (this->SupportData).HasCoreOnly = (other->SupportData).HasCoreOnly;
  uVar4 = (other->SupportData).NumCigarOperations;
  uVar5 = (other->SupportData).QueryNameLength;
  uVar6 = (other->SupportData).QuerySequenceLength;
  (this->SupportData).BlockLength = (other->SupportData).BlockLength;
  (this->SupportData).NumCigarOperations = uVar4;
  (this->SupportData).QueryNameLength = uVar5;
  (this->SupportData).QuerySequenceLength = uVar6;
  (this->ErrorString)._M_dataplus._M_p = (pointer)&(this->ErrorString).field_2;
  (this->ErrorString)._M_string_length = 0;
  (this->ErrorString).field_2._M_local_buf[0] = '\0';
  return;
}

Assistant:

BamAlignment::BamAlignment(const BamAlignment& other)
    : Name(other.Name)
    , Length(other.Length)
    , QueryBases(other.QueryBases)
    , AlignedBases(other.AlignedBases)
    , Qualities(other.Qualities)
    , TagData(other.TagData)
    , RefID(other.RefID)
    , Position(other.Position)
    , Bin(other.Bin)
    , MapQuality(other.MapQuality)
    , AlignmentFlag(other.AlignmentFlag)
    , CigarData(other.CigarData)
    , MateRefID(other.MateRefID)
    , MatePosition(other.MatePosition)
    , InsertSize(other.InsertSize)
    , Filename(other.Filename)
    , SupportData(other.SupportData)
{ }